

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_initialized_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  undefined8 in_RAX;
  ctl_arena_t *pcVar2;
  size_t copylen;
  ulong uVar3;
  _Bool initialized;
  undefined8 uStack_28;
  
  iVar1 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    uVar3 = mib[1];
    iVar1 = 0xe;
    if (uVar3 >> 0x20 == 0) {
      uStack_28 = in_RAX;
      iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      if (iVar1 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
        ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
      }
      ctl_mtx.field_0.field_0.prof_data.n_lock_ops =
           ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
      if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        ctl_mtx.field_0.witness.link.qre_prev =
             (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
        ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
      }
      pcVar2 = arenas_i(uVar3);
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
      uStack_28._7_1_ = pcVar2->initialized;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
      iVar1 = 0;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        if (*oldlenp == 1) {
          *(undefined1 *)oldp = uStack_28._7_1_;
        }
        else {
          uVar3 = (ulong)(*oldlenp != 0);
          switchD_00b1522a::default(oldp,(void *)((long)&uStack_28 + 7),uVar3);
          *oldlenp = uVar3;
          iVar1 = 0x16;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int
arena_i_initialized_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	tsdn_t *tsdn = tsd_tsdn(tsd);
	unsigned arena_ind;
	bool initialized;

	READONLY();
	MIB_UNSIGNED(arena_ind, 1);

	malloc_mutex_lock(tsdn, &ctl_mtx);
	initialized = arenas_i(arena_ind)->initialized;
	malloc_mutex_unlock(tsdn, &ctl_mtx);

	READ(initialized, bool);

	ret = 0;
label_return:
	return ret;
}